

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_invalid_opc.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::ReplaceInvalidOpcodePass::GetSpecialConstant
          (ReplaceInvalidOpcodePass *this,uint32_t type_id)

{
  uint uVar1;
  Op OVar2;
  uint32_t uVar3;
  IRContext *pIVar4;
  ConstantManager *this_00;
  TypeManager *this_01;
  DefUseManager *this_02;
  Instruction *pIVar5;
  Type *pTVar6;
  bool bVar7;
  value_type_conflict local_80;
  uint local_7c;
  undefined1 local_78 [4];
  uint32_t i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> literal_words;
  undefined1 local_58 [4];
  uint32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  uint32_t component_const;
  Instruction *type;
  TypeManager *type_mgr;
  ConstantManager *const_mgr;
  Constant *special_const;
  uint32_t type_id_local;
  ReplaceInvalidOpcodePass *this_local;
  
  pIVar4 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_constant_mgr(pIVar4);
  pIVar4 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_type_mgr(pIVar4);
  pIVar4 = Pass::context(&this->super_Pass);
  this_02 = IRContext::get_def_use_mgr(pIVar4);
  pIVar5 = analysis::DefUseManager::GetDef(this_02,type_id);
  OVar2 = opt::Instruction::opcode(pIVar5);
  if (OVar2 == OpTypeVector) {
    uVar3 = opt::Instruction::GetSingleWordInOperand(pIVar5,0);
    ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = GetSpecialConstant(this,uVar3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
    literal_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    while( true ) {
      uVar1 = literal_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_;
      uVar3 = opt::Instruction::GetSingleWordInOperand(pIVar5,1);
      if (uVar3 <= uVar1) break;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,
                 (value_type_conflict *)
                 ((long)&ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage + 4));
      literal_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           literal_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    }
    pTVar6 = analysis::TypeManager::GetType(this_01,type_id);
    const_mgr = (ConstantManager *)
                analysis::ConstantManager::GetConstant
                          (this_00,pTVar6,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  }
  else {
    OVar2 = opt::Instruction::opcode(pIVar5);
    bVar7 = true;
    if (OVar2 != OpTypeInt) {
      OVar2 = opt::Instruction::opcode(pIVar5);
      bVar7 = OVar2 == OpTypeFloat;
    }
    if (!bVar7) {
      __assert_fail("type->opcode() == spv::Op::OpTypeInt || type->opcode() == spv::Op::OpTypeFloat"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_invalid_opc.cpp"
                    ,0xc5,
                    "uint32_t spvtools::opt::ReplaceInvalidOpcodePass::GetSpecialConstant(uint32_t)"
                   );
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
    local_7c = 0;
    while( true ) {
      uVar1 = local_7c;
      uVar3 = opt::Instruction::GetSingleWordInOperand(pIVar5,0);
      if (uVar3 <= uVar1) break;
      local_80 = 0xdeadbeef;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,&local_80);
      local_7c = local_7c + 0x20;
    }
    pTVar6 = analysis::TypeManager::GetType(this_01,type_id);
    const_mgr = (ConstantManager *)
                analysis::ConstantManager::GetConstant
                          (this_00,pTVar6,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
  }
  if (const_mgr != (ConstantManager *)0x0) {
    pIVar5 = analysis::ConstantManager::GetDefiningInstruction
                       (this_00,(Constant *)const_mgr,0,(inst_iterator *)0x0);
    uVar3 = opt::Instruction::result_id(pIVar5);
    return uVar3;
  }
  __assert_fail("special_const != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_invalid_opc.cpp"
                ,0xcd,
                "uint32_t spvtools::opt::ReplaceInvalidOpcodePass::GetSpecialConstant(uint32_t)");
}

Assistant:

uint32_t ReplaceInvalidOpcodePass::GetSpecialConstant(uint32_t type_id) {
  const analysis::Constant* special_const = nullptr;
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();

  Instruction* type = context()->get_def_use_mgr()->GetDef(type_id);
  if (type->opcode() == spv::Op::OpTypeVector) {
    uint32_t component_const =
        GetSpecialConstant(type->GetSingleWordInOperand(0));
    std::vector<uint32_t> ids;
    for (uint32_t i = 0; i < type->GetSingleWordInOperand(1); ++i) {
      ids.push_back(component_const);
    }
    special_const = const_mgr->GetConstant(type_mgr->GetType(type_id), ids);
  } else {
    assert(type->opcode() == spv::Op::OpTypeInt ||
           type->opcode() == spv::Op::OpTypeFloat);
    std::vector<uint32_t> literal_words;
    for (uint32_t i = 0; i < type->GetSingleWordInOperand(0); i += 32) {
      literal_words.push_back(0xDEADBEEF);
    }
    special_const =
        const_mgr->GetConstant(type_mgr->GetType(type_id), literal_words);
  }
  assert(special_const != nullptr);
  return const_mgr->GetDefiningInstruction(special_const)->result_id();
}